

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

int __thiscall libtorrent::aux::torrent::priority(torrent *this)

{
  int iVar1;
  int iVar2;
  peer_class_t c;
  undefined4 extraout_var;
  peer_class *ppVar3;
  int *piVar4;
  undefined1 local_28 [8];
  span<const_int> prio;
  int i;
  int priority;
  torrent *this_local;
  
  prio.m_len._4_4_ = 0;
  prio.m_len._0_4_ = 0;
  while( true ) {
    iVar2 = (int)prio.m_len;
    iVar1 = peer_class_set::num_classes(&this->super_peer_class_set);
    if (iVar1 <= iVar2) break;
    iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x32])();
    c = peer_class_set::class_at(&this->super_peer_class_set,(int)prio.m_len);
    ppVar3 = peer_class_pool::at((peer_class_pool *)CONCAT44(extraout_var,iVar2),c);
    span<int_const>::span<int,2ul>((span<int_const> *)local_28,&ppVar3->priority);
    piVar4 = span<const_int>::operator[]((span<const_int> *)local_28,0);
    piVar4 = ::std::max<int>((int *)((long)&prio.m_len + 4),piVar4);
    prio.m_len._4_4_ = *piVar4;
    piVar4 = span<const_int>::operator[]((span<const_int> *)local_28,1);
    piVar4 = ::std::max<int>((int *)((long)&prio.m_len + 4),piVar4);
    prio.m_len._4_4_ = *piVar4;
    prio.m_len._0_4_ = (int)prio.m_len + 1;
  }
  return prio.m_len._4_4_;
}

Assistant:

int torrent::priority() const
	{
		int priority = 0;
		for (int i = 0; i < num_classes(); ++i)
		{
			span<int const> prio = m_ses.peer_classes().at(class_at(i))->priority;
			priority = std::max(priority, prio[peer_connection::upload_channel]);
			priority = std::max(priority, prio[peer_connection::download_channel]);
		}
		return priority;
	}